

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

EStatusCode __thiscall
CFFFileInput::CalculateDependenciesForCharIndex
          (CFFFileInput *this,unsigned_short inFontIndex,unsigned_short inCharStringIndex,
          CharString2Dependencies *ioDependenciesInfo)

{
  EStatusCode EVar1;
  CharString *inCharStringToIntepret;
  Trace *this_00;
  CharString *charString;
  undefined1 local_78 [4];
  EStatusCode status;
  CharStringType2Interpreter interpreter;
  CharString2Dependencies *ioDependenciesInfo_local;
  unsigned_short inCharStringIndex_local;
  unsigned_short inFontIndex_local;
  CFFFileInput *this_local;
  
  interpreter._72_8_ = ioDependenciesInfo;
  CharStringType2Interpreter::CharStringType2Interpreter((CharStringType2Interpreter *)local_78);
  EVar1 = PrepareForGlyphIntepretation(this,inFontIndex,inCharStringIndex);
  if (EVar1 == eFailure) {
    this_local._4_4_ = eFailure;
  }
  else {
    this->mCurrentDependencies = (CharString2Dependencies *)interpreter._72_8_;
    inCharStringToIntepret = GetGlyphCharString(this,inFontIndex,inCharStringIndex);
    if (inCharStringToIntepret == (CharString *)0x0) {
      this_00 = Trace::DefaultTrace();
      Trace::TraceToLog(this_00,"GetGlyphCharString cannot find char string");
      this_local._4_4_ = eFailure;
    }
    else {
      this_local._4_4_ =
           CharStringType2Interpreter::Intepret
                     ((CharStringType2Interpreter *)local_78,inCharStringToIntepret,
                      (IType2InterpreterImplementation *)this);
    }
  }
  CharStringType2Interpreter::~CharStringType2Interpreter((CharStringType2Interpreter *)local_78);
  return this_local._4_4_;
}

Assistant:

EStatusCode CFFFileInput::CalculateDependenciesForCharIndex(unsigned short inFontIndex,
															unsigned short inCharStringIndex,
															CharString2Dependencies& ioDependenciesInfo)
{
	CharStringType2Interpreter interpreter;

	EStatusCode status = PrepareForGlyphIntepretation(inFontIndex,inCharStringIndex);
	if(status != PDFHummus::eFailure)
	{
		mCurrentDependencies = &ioDependenciesInfo;
		CharString* charString = GetGlyphCharString(inFontIndex,inCharStringIndex);
        if(!charString)
        {
            TRACE_LOG("GetGlyphCharString cannot find char string");
            return PDFHummus::eFailure;
        }
		return interpreter.Intepret(*charString, this);
	}
	else
		return status;
}